

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_io_primitive_printLine
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint uVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  size_t __size;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar4 = *arguments;
  if (((uVar4 & 0xf) == 0 && uVar4 != 0) && (uVar1 = *(uint *)(uVar4 + 0xc), 7 < uVar1)) {
    uVar4 = 0;
    do {
      uVar2 = *arguments;
      if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
        sVar3 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + uVar4 * 8);
      }
      else {
        sVar3 = 0;
      }
      sVar3 = sysbvm_tuple_asString(context,sVar3);
      if ((sVar3 & 0xf) == 0 && sVar3 != 0) {
        if ((*(uint *)(sVar3 + 8) & 0x300) != 0x200) {
          sysbvm_error_assertionFailure
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/io.c:107: assertion failure: sysbvm_tuple_isBytes(string)"
                    );
        }
        __size = (size_t)*(uint *)(sVar3 + 0xc);
      }
      else {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/io.c:107: assertion failure: sysbvm_tuple_isBytes(string)"
                  );
        __size = 0;
      }
      fwrite((void *)(sVar3 + 0x10),__size,1,_stdout);
      uVar4 = uVar4 + 1;
    } while (uVar1 >> 3 != uVar4);
  }
  fputc(10,_stdout);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_io_primitive_printLine(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    size_t parameterCount = sysbvm_array_getSize(arguments[0]);
    for(size_t i = 0; i < parameterCount; ++i)
    {
        sysbvm_tuple_t string = sysbvm_tuple_asString(context, sysbvm_array_at(arguments[0], i));
        SYSBVM_ASSERT(sysbvm_tuple_isBytes(string));
        fwrite(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes, sysbvm_tuple_getSizeInBytes(string), 1, stdout);

    }
    fwrite("\n", 1, 1, stdout);

    return SYSBVM_VOID_TUPLE;
}